

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void TestGrammaAnalysis(char *test_file_name)

{
  bool bVar1;
  ostream *poVar2;
  SymbolQueue *pSVar3;
  undefined1 local_a70 [8];
  Program program;
  undefined1 local_480 [4];
  SymbolName name;
  Symbol symbol;
  undefined1 local_438 [8];
  LexicalAnalysis lexical_analysis;
  int ret;
  char *test_file_name_local;
  
  lexical_analysis._1052_4_ = 0;
  LexicalAnalysis::LexicalAnalysis((LexicalAnalysis *)local_438,test_file_name);
  bVar1 = LexicalAnalysis::CheckFile((LexicalAnalysis *)local_438);
  if (bVar1) {
    Symbol::Symbol((Symbol *)local_480);
    pSVar3 = (SymbolQueue *)operator_new(0x20);
    SymbolQueue::SymbolQueue(pSVar3);
    handle_symbol_queue = pSVar3;
    do {
      lexical_analysis._1052_4_ =
           LexicalAnalysis::GetSym((LexicalAnalysis *)local_438,(Symbol *)local_480);
      SymbolQueue::PushSymbol(handle_symbol_queue,(Symbol *)local_480);
      program.m_main_function.m_compound_statement.m_statement_list.m_statement.m_statement_list_ptr
      ._4_4_ = Symbol::GetName((Symbol *)local_480);
    } while (program.m_main_function.m_compound_statement.m_statement_list.m_statement.
             m_statement_list_ptr._4_4_ != EOF_SYM);
    poVar2 = std::operator<<((ostream *)&std::cout,"push over");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Program::Program((Program *)local_a70);
    Program::Parse((Program *)local_a70);
    pSVar3 = handle_symbol_queue;
    if (handle_symbol_queue != (SymbolQueue *)0x0) {
      SymbolQueue::~SymbolQueue(handle_symbol_queue);
      operator_delete(pSVar3);
    }
    Program::~Program((Program *)local_a70);
    Symbol::~Symbol((Symbol *)local_480);
    symbol.m_line_number = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"bad file");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    symbol.m_line_number = 1;
  }
  LexicalAnalysis::~LexicalAnalysis((LexicalAnalysis *)local_438);
  return;
}

Assistant:

void TestGrammaAnalysis(const char* test_file_name) {
    int ret = COMPILE_OK;
    LexicalAnalysis lexical_analysis(test_file_name);
    if (!lexical_analysis.CheckFile()) {
        std::cerr << "bad file" << endl;
        return;
    }
    Symbol symbol;
    handle_symbol_queue = new SymbolQueue;
    while (true) {
        ret = lexical_analysis.GetSym(symbol);
        handle_symbol_queue->PushSymbol(symbol);
        SymbolName name = symbol.GetName();
        if (name == EOF_SYM)
            break;
    }
    cout << "push over" << endl;
    Program program;
    program.Parse();
    delete(handle_symbol_queue);
}